

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseTerminal(ParseContext *ctx)

{
  Lexeme *begin;
  undefined1 auVar1 [8];
  bool bVar2;
  LexemeType type_00;
  uint uVar3;
  SynError *this;
  SynGetAddress *this_00;
  SynCharacter *this_01;
  Lexeme *pLVar4;
  SynUnaryOp *this_02;
  SynPreModify *pSVar5;
  SynNumber *pSVar6;
  SynNew *pSVar7;
  SynBase *pSVar8;
  SynFunctionDefinition *pSVar9;
  SynShortFunctionDefinition *pSVar10;
  SynBase *node_6;
  SynBase *node_5;
  SynBase *node_4;
  SynBase *node_3;
  SynNew *node_2;
  SynNumber *node_1;
  SynBase *value_2;
  SynBase *value_1;
  SynBase *value;
  InplaceStr name;
  SynUnaryOpType type;
  undefined1 local_38 [8];
  InplaceStr str;
  SynBase *node;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar2 = ParseContext::Consume(ctx,lex_true);
  if (bVar2) {
    pSVar8 = &ParseContext::get<SynBool>(ctx)->super_SynBase;
    pLVar4 = ParseContext::Previous(ctx);
    SynBool::SynBool((SynBool *)pSVar8,begin,pLVar4,true);
    return pSVar8;
  }
  bVar2 = ParseContext::Consume(ctx,lex_false);
  if (bVar2) {
    pSVar8 = &ParseContext::get<SynBool>(ctx)->super_SynBase;
    pLVar4 = ParseContext::Previous(ctx);
    SynBool::SynBool((SynBool *)pSVar8,begin,pLVar4,false);
    return pSVar8;
  }
  bVar2 = ParseContext::Consume(ctx,lex_nullptr);
  if (bVar2) {
    pSVar8 = &ParseContext::get<SynNullptr>(ctx)->super_SynBase;
    pLVar4 = ParseContext::Previous(ctx);
    SynNullptr::SynNullptr((SynNullptr *)pSVar8,begin,pLVar4);
    return pSVar8;
  }
  bVar2 = ParseContext::Consume(ctx,lex_bitand);
  if (bVar2) {
    str.end = (char *)ParseComplexTerminal(ctx);
    if ((SynBase *)str.end == (SynBase *)0x0) {
      pLVar4 = ParseContext::Current(ctx);
      anon_unknown.dwarf_11716f::Report(ctx,pLVar4,"ERROR: variable not found after \'&\'");
      this = ParseContext::get<SynError>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynError::SynError(this,begin,pLVar4);
      str.end = (char *)this;
    }
    this_00 = ParseContext::get<SynGetAddress>(ctx);
    pLVar4 = ParseContext::Previous(ctx);
    SynGetAddress::SynGetAddress(this_00,begin,pLVar4,(SynBase *)str.end);
    return &this_00->super_SynBase;
  }
  bVar2 = ParseContext::At(ctx,lex_semiquotedchar);
  if (!bVar2) {
    type_00 = ParseContext::Peek(ctx);
    name.end._4_4_ = GetUnaryOpType(type_00);
    if (name.end._4_4_ != SYN_UNARY_OP_UNKNOWN) {
      _value = ParseContext::Consume(ctx);
      value_1 = ParseTerminal(ctx);
      if (value_1 == (SynBase *)0x0) {
        pLVar4 = ParseContext::Current(ctx);
        uVar3 = InplaceStr::length((InplaceStr *)&value);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar4,"ERROR: expression not found after \'%.*s\'",(ulong)uVar3,value);
        value_1 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar4 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)value_1,begin,pLVar4);
      }
      this_02 = ParseContext::get<SynUnaryOp>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynUnaryOp::SynUnaryOp(this_02,begin,pLVar4,name.end._4_4_,value_1);
      return &this_02->super_SynBase;
    }
    bVar2 = ParseContext::Consume(ctx,lex_dec);
    if (bVar2) {
      value_2 = ParseTerminal(ctx);
      if (value_2 == (SynBase *)0x0) {
        pLVar4 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar4,"ERROR: variable not found after \'--\'");
        value_2 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar4 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)value_2,begin,pLVar4);
      }
      pSVar5 = ParseContext::get<SynPreModify>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynPreModify::SynPreModify(pSVar5,begin,pLVar4,value_2,false);
      return &pSVar5->super_SynBase;
    }
    bVar2 = ParseContext::Consume(ctx,lex_inc);
    if (bVar2) {
      node_1 = (SynNumber *)ParseTerminal(ctx);
      if (node_1 == (SynNumber *)0x0) {
        pLVar4 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar4,"ERROR: variable not found after \'++\'");
        node_1 = (SynNumber *)ParseContext::get<SynError>(ctx);
        pLVar4 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)node_1,begin,pLVar4);
      }
      pSVar5 = ParseContext::get<SynPreModify>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynPreModify::SynPreModify(pSVar5,begin,pLVar4,&node_1->super_SynBase,true);
      return &pSVar5->super_SynBase;
    }
    pSVar6 = ParseNumber(ctx);
    if (pSVar6 != (SynNumber *)0x0) {
      return &pSVar6->super_SynBase;
    }
    pSVar7 = ParseNew(ctx);
    if (pSVar7 != (SynNew *)0x0) {
      return &pSVar7->super_SynBase;
    }
    pSVar8 = ParseSizeof(ctx);
    if (pSVar8 != (SynBase *)0x0) {
      return pSVar8;
    }
    pSVar9 = ParseFunctionDefinition(ctx);
    if (pSVar9 != (SynFunctionDefinition *)0x0) {
      return &pSVar9->super_SynBase;
    }
    pSVar10 = ParseShortFunctionDefinition(ctx);
    if (pSVar10 != (SynShortFunctionDefinition *)0x0) {
      return &pSVar10->super_SynBase;
    }
    pSVar8 = ParseComplexTerminal(ctx);
    if (pSVar8 != (SynBase *)0x0) {
      return pSVar8;
    }
    return (SynBase *)0x0;
  }
  _local_38 = ParseContext::Consume(ctx);
  uVar3 = InplaceStr::length((InplaceStr *)local_38);
  if (uVar3 != 1) {
    auVar1 = local_38;
    uVar3 = InplaceStr::length((InplaceStr *)local_38);
    if (*(char *)((long)auVar1 + (ulong)(uVar3 - 1)) == '\'') {
      uVar3 = InplaceStr::length((InplaceStr *)local_38);
      if (((uVar3 < 4) || (*(char *)((long)local_38 + 1) == '\\')) &&
         (uVar3 = InplaceStr::length((InplaceStr *)local_38), uVar3 < 5)) {
        uVar3 = InplaceStr::length((InplaceStr *)local_38);
        if (uVar3 < 3) {
          anon_unknown.dwarf_11716f::Stop(ctx,begin,"ERROR: empty character constant");
        }
      }
      else {
        anon_unknown.dwarf_11716f::Stop
                  (ctx,begin,"ERROR: only one character can be inside single quotes");
      }
      goto LAB_0029773b;
    }
  }
  anon_unknown.dwarf_11716f::Stop(ctx,begin,"ERROR: unclosed character constant");
LAB_0029773b:
  this_01 = ParseContext::get<SynCharacter>(ctx);
  pLVar4 = ParseContext::Previous(ctx);
  SynCharacter::SynCharacter(this_01,begin,pLVar4,_local_38);
  return &this_01->super_SynBase;
}

Assistant:

SynBase* ParseTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_true))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), true);

	if(ctx.Consume(lex_false))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), false);

	if(ctx.Consume(lex_nullptr))
		return new (ctx.get<SynNullptr>()) SynNullptr(start, ctx.Previous());

	if(ctx.Consume(lex_bitand))
	{
		SynBase *node = ParseComplexTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '&'");

			node = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynGetAddress>()) SynGetAddress(start, ctx.Previous(), node);
	}

	if(ctx.At(lex_semiquotedchar))
	{
		InplaceStr str = ctx.Consume();

		if(str.length() == 1 || str.begin[str.length() - 1] != '\'')
			Stop(ctx, start, "ERROR: unclosed character constant");
		else if((str.length() > 3 && str.begin[1] != '\\') || str.length() > 4)
			Stop(ctx, start, "ERROR: only one character can be inside single quotes");
		else if(str.length() < 3)
			Stop(ctx, start, "ERROR: empty character constant");

		return new (ctx.get<SynCharacter>()) SynCharacter(start, ctx.Previous(), str);
	}

	if(SynUnaryOpType type = GetUnaryOpType(ctx.Peek()))
	{
		InplaceStr name = ctx.Consume();

		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s'", name.length(), name.begin);

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynUnaryOp>()) SynUnaryOp(start, ctx.Previous(), type, value);
	}

	if(ctx.Consume(lex_dec))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '--'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, false);
	}

	if(ctx.Consume(lex_inc))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '++'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, true);
	}

	if(SynNumber *node = ParseNumber(ctx))
		return node;

	if(SynNew *node = ParseNew(ctx))
		return node;

	if(SynBase *node = ParseSizeof(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseShortFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseComplexTerminal(ctx))
		return node;

	return NULL;
}